

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFilters.cpp
# Opt level: O2

double __thiscall chrono::utils::ChRunningAverage::Add(ChRunningAverage *this,double val)

{
  int iVar1;
  ChRunningAverage *pCVar2;
  double dVar3;
  double dVar4;
  value_type_conflict1 vVar5;
  undefined8 extraout_XMM0_Qb;
  undefined1 auVar6 [16];
  _Expr<std::__detail::_BinClos<std::_Pow,_std::_Expr,_std::_Constant,_std::__detail::_BinClos<std::__minus,_std::_ValArray,_std::_Constant,_double,_double>,_double>,_double>
  local_30;
  
  iVar1 = this->m_index;
  this->m_index = iVar1 + 1;
  pCVar2 = (ChRunningAverage *)&this->m_index;
  if (this->m_n <= iVar1) {
    pCVar2 = this;
  }
  (this->m_data)._M_data[iVar1 % this->m_n] = val;
  iVar1 = pCVar2->m_n;
  dVar3 = std::valarray<double>::sum(&this->m_data);
  dVar4 = 0.0;
  if (iVar1 != 1) {
    local_30._M_closure.
    super__BinBase2<std::_Pow,_std::__detail::_BinClos<std::__minus,_std::_ValArray,_std::_Constant,_double,_double>_>
    ._M_expr2 = 2.0;
    local_30._M_closure.
    super__BinBase2<std::_Pow,_std::__detail::_BinClos<std::__minus,_std::_ValArray,_std::_Constant,_double,_double>_>
    ._M_expr1.super__BinBase2<std::__minus,_std::valarray<double>_>._M_expr1 = &this->m_data;
    local_30._M_closure.
    super__BinBase2<std::_Pow,_std::__detail::_BinClos<std::__minus,_std::_ValArray,_std::_Constant,_double,_double>_>
    ._M_expr1.super__BinBase2<std::__minus,_std::valarray<double>_>._M_expr2 = dVar3 / (double)iVar1
    ;
    vVar5 = std::
            _Expr<std::__detail::_BinClos<std::_Pow,_std::_Expr,_std::_Constant,_std::__detail::_BinClos<std::__minus,_std::_ValArray,_std::_Constant,_double,_double>,_double>,_double>
            ::sum(&local_30);
    auVar6._0_8_ = vVar5 / (double)(iVar1 + -1);
    auVar6._8_8_ = extraout_XMM0_Qb;
    if (auVar6._0_8_ < 0.0) {
      dVar4 = sqrt(auVar6._0_8_);
    }
    else {
      auVar6 = vsqrtsd_avx(auVar6,auVar6);
      dVar4 = auVar6._0_8_;
    }
  }
  this->m_std = dVar4;
  return dVar3 / (double)iVar1;
}

Assistant:

double ChRunningAverage::Add(double val) {
    m_data[(m_index++) % m_n] = val;
    int size = std::min(m_index, m_n);
    double mean = m_data.sum() / size;
    m_std = (size == 1) ? 0 : std::sqrt(std::pow(m_data - mean, 2.0).sum() / (size - 1));
    return mean;
}